

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddSubDirectoryCommand.cxx
# Opt level: O2

bool cmAddSubDirectoryCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmMakefile *this;
  size_type sVar1;
  bool bVar2;
  bool excludeFromAll;
  byte bVar3;
  bool bVar4;
  string *psVar5;
  string *psVar6;
  size_type __n;
  size_type __pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  cmAlphaNum local_148;
  string binPath;
  string srcPath;
  string binArg;
  string local_a0;
  cmAlphaNum local_80;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  psVar5 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar6 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (psVar5 == psVar6) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"called with incorrect number of arguments",
               (allocator<char> *)&local_80);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&local_148);
    return false;
  }
  this = status->Makefile;
  binArg._M_dataplus._M_p = (pointer)&binArg.field_2;
  binArg._M_string_length = 0;
  binArg.field_2._M_local_buf[0] = '\0';
  bVar3 = 0;
  excludeFromAll = false;
  __lhs = psVar5;
  while (__lhs = __lhs + 1, __lhs != psVar6) {
    bVar2 = std::operator==(__lhs,"EXCLUDE_FROM_ALL");
    if (bVar2) {
      excludeFromAll = true;
    }
    else {
      bVar2 = std::operator==(__lhs,"SYSTEM");
      if (bVar2) {
        bVar3 = 1;
      }
      else {
        if (binArg._M_string_length != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_148,"called with incorrect number of arguments",
                     (allocator<char> *)&local_80);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          std::__cxx11::string::~string((string *)&local_148);
          bVar2 = false;
          goto LAB_0020259b;
        }
        std::__cxx11::string::_M_assign((string *)&binArg);
      }
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"SYSTEM",(allocator<char> *)&local_80);
  bVar4 = cmMakefile::GetPropertyAsBool(this,(string *)&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  srcPath._M_dataplus._M_p = (pointer)&srcPath.field_2;
  srcPath._M_string_length = 0;
  srcPath.field_2._M_local_buf[0] = '\0';
  bVar2 = cmsys::SystemTools::FileIsFullPath(psVar5);
  if (bVar2) {
    std::__cxx11::string::_M_assign((string *)&srcPath);
  }
  else {
    psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
    local_148.View_._M_str = (psVar6->_M_dataplus)._M_p;
    local_148.View_._M_len = psVar6->_M_string_length;
    local_80.View_._M_str = local_80.Digits_;
    local_80.View_._M_len = 1;
    local_80.Digits_[0] = '/';
    cmStrCat<std::__cxx11::string>(&binPath,&local_148,&local_80,psVar5);
    std::__cxx11::string::operator=((string *)&srcPath,(string *)&binPath);
    std::__cxx11::string::~string((string *)&binPath);
  }
  bVar2 = cmsys::SystemTools::FileIsDirectory(&srcPath);
  if (!bVar2) {
    local_148.View_._M_str = "given source \"";
    local_148.View_._M_len = 0xe;
    local_80.View_._M_str = (psVar5->_M_dataplus)._M_p;
    local_80.View_._M_len = psVar5->_M_string_length;
    cmStrCat<char[38]>(&binPath,&local_148,&local_80,
                       (char (*) [38])"\" which is not an existing directory.");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&binPath);
    bVar2 = false;
    goto LAB_00202591;
  }
  psVar5 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_(this);
  cmsys::SystemTools::CollapseFullPath((string *)&local_148,&srcPath,psVar5);
  std::__cxx11::string::operator=((string *)&srcPath,(string *)&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  binPath._M_dataplus._M_p = (pointer)&binPath.field_2;
  binPath._M_string_length = 0;
  binPath.field_2._M_local_buf[0] = '\0';
  if (binArg._M_string_length == 0) {
    psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
    bVar2 = cmsys::SystemTools::IsSubDirectory(&srcPath,psVar5);
    if (bVar2) {
      psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
      psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
      sVar1 = psVar5->_M_string_length;
      local_40._M_len = psVar6->_M_string_length;
      if (sVar1 == 0) {
        __pos = 0;
      }
      else {
        __pos = sVar1 - ((psVar5->_M_dataplus)._M_p[sVar1 - 1] == '/');
      }
      local_40._M_str = (psVar6->_M_dataplus)._M_p;
      if (local_40._M_len == 0) {
        __n = 0;
      }
      else {
        __n = local_40._M_len - (local_40._M_str[local_40._M_len - 1] == '/');
      }
      local_148.View_ =
           std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_40,0,__n);
      local_50._M_len = srcPath._M_string_length;
      local_50._M_str = srcPath._M_dataplus._M_p;
      local_80.View_ =
           std::basic_string_view<char,_std::char_traits<char>_>::substr
                     (&local_50,__pos,0xffffffffffffffff);
      cmStrCat<>(&local_a0,&local_148,&local_80);
      goto LAB_00202512;
    }
    local_148.View_._M_str = "not given a binary directory but the given source ";
    local_148.View_._M_len = 0x32;
    local_80.View_._M_str = "directory \"";
    local_80.View_._M_len = 0xb;
    psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
    cmStrCat<std::__cxx11::string,char[29],std::__cxx11::string,char[91]>
              (&local_a0,&local_148,&local_80,&srcPath,
               (char (*) [29])"\" is not a subdirectory of \"",psVar5,
               (char (*) [91])
               "\".  When specifying an out-of-tree source a binary directory must be explicitly specified."
              );
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&local_a0);
    bVar2 = false;
  }
  else {
    bVar2 = cmsys::SystemTools::FileIsFullPath(&binArg);
    if (bVar2) {
      std::__cxx11::string::_M_assign((string *)&binPath);
    }
    else {
      psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
      local_148.View_._M_str = (psVar5->_M_dataplus)._M_p;
      local_148.View_._M_len = psVar5->_M_string_length;
      local_80.View_._M_str = local_80.Digits_;
      local_80.View_._M_len = 1;
      local_80.Digits_[0] = '/';
      cmStrCat<std::__cxx11::string>(&local_a0,&local_148,&local_80,&binArg);
LAB_00202512:
      std::__cxx11::string::operator=((string *)&binPath,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    cmsys::SystemTools::CollapseFullPath((string *)&local_148,&binPath);
    std::__cxx11::string::operator=((string *)&binPath,(string *)&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    bVar2 = true;
    cmMakefile::AddSubDirectory(this,&srcPath,&binPath,excludeFromAll,true,(bool)(bVar4 | bVar3));
  }
  std::__cxx11::string::~string((string *)&binPath);
LAB_00202591:
  std::__cxx11::string::~string((string *)&srcPath);
LAB_0020259b:
  std::__cxx11::string::~string((string *)&binArg);
  return bVar2;
}

Assistant:

bool cmAddSubDirectoryCommand(std::vector<std::string> const& args,
                              cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  // store the binpath
  std::string const& srcArg = args.front();
  std::string binArg;

  bool excludeFromAll = false;
  bool system = false;

  // process the rest of the arguments looking for optional args
  for (std::string const& arg : cmMakeRange(args).advance(1)) {
    if (arg == "EXCLUDE_FROM_ALL") {
      excludeFromAll = true;
      continue;
    }
    if (arg == "SYSTEM") {
      system = true;
      continue;
    }
    if (binArg.empty()) {
      binArg = arg;
    } else {
      status.SetError("called with incorrect number of arguments");
      return false;
    }
  }
  // "SYSTEM" directory property should also affects targets in nested
  // subdirectories.
  if (mf.GetPropertyAsBool("SYSTEM")) {
    system = true;
  }

  // Compute the full path to the specified source directory.
  // Interpret a relative path with respect to the current source directory.
  std::string srcPath;
  if (cmSystemTools::FileIsFullPath(srcArg)) {
    srcPath = srcArg;
  } else {
    srcPath = cmStrCat(mf.GetCurrentSourceDirectory(), '/', srcArg);
  }
  if (!cmSystemTools::FileIsDirectory(srcPath)) {
    std::string error = cmStrCat("given source \"", srcArg,
                                 "\" which is not an existing directory.");
    status.SetError(error);
    return false;
  }
  srcPath =
    cmSystemTools::CollapseFullPath(srcPath, mf.GetHomeOutputDirectory());

  // Compute the full path to the binary directory.
  std::string binPath;
  if (binArg.empty()) {
    // No binary directory was specified.  If the source directory is
    // not a subdirectory of the current directory then it is an
    // error.
    if (!cmSystemTools::IsSubDirectory(srcPath,
                                       mf.GetCurrentSourceDirectory())) {
      status.SetError(
        cmStrCat("not given a binary directory but the given source ",
                 "directory \"", srcPath, "\" is not a subdirectory of \"",
                 mf.GetCurrentSourceDirectory(),
                 "\".  When specifying an "
                 "out-of-tree source a binary directory must be explicitly "
                 "specified."));
      return false;
    }

    // Remove the CurrentDirectory from the srcPath and replace it
    // with the CurrentOutputDirectory.
    const std::string& src = mf.GetCurrentSourceDirectory();
    const std::string& bin = mf.GetCurrentBinaryDirectory();
    size_t srcLen = src.length();
    size_t binLen = bin.length();
    if (srcLen > 0 && src.back() == '/') {
      --srcLen;
    }
    if (binLen > 0 && bin.back() == '/') {
      --binLen;
    }
    binPath = cmStrCat(cm::string_view(bin).substr(0, binLen),
                       cm::string_view(srcPath).substr(srcLen));
  } else {
    // Use the binary directory specified.
    // Interpret a relative path with respect to the current binary directory.
    if (cmSystemTools::FileIsFullPath(binArg)) {
      binPath = binArg;
    } else {
      binPath = cmStrCat(mf.GetCurrentBinaryDirectory(), '/', binArg);
    }
  }
  binPath = cmSystemTools::CollapseFullPath(binPath);

  // Add the subdirectory using the computed full paths.
  mf.AddSubDirectory(srcPath, binPath, excludeFromAll, true, system);

  return true;
}